

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.h
# Opt level: O3

bool __thiscall
SigningProvider::GetPubKeyByXOnly(SigningProvider *this,XOnlyPubKey *pubkey,CPubKey *out)

{
  int iVar1;
  CKeyID *id;
  pointer pCVar2;
  byte bVar3;
  long in_FS_OFFSET;
  vector<CKeyID,_std::allocator<CKeyID>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  XOnlyPubKey::GetKeyIDs(&local_48,pubkey);
  pCVar2 = local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar3 = 0;
  }
  else {
    do {
      iVar1 = (*this->_vptr_SigningProvider[4])(this,pCVar2,out);
      pCVar2 = pCVar2 + 1;
      bVar3 = (byte)iVar1;
    } while ((pCVar2 == local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                        super__Vector_impl_data._M_finish | bVar3) != 1);
  }
  if (local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)bVar3;
}

Assistant:

bool GetPubKeyByXOnly(const XOnlyPubKey& pubkey, CPubKey& out) const
    {
        for (const auto& id : pubkey.GetKeyIDs()) {
            if (GetPubKey(id, out)) return true;
        }
        return false;
    }